

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

mmkuser_malloc_mock_returntype mmkuser_malloc_mock_stub(size_t param0)

{
  mmk_matcher *pmVar1;
  int iVar2;
  mmk_matcher_kind mVar3;
  mmk_stub_conflict stub;
  mmk_mock_ctx *mock_00;
  void *data;
  mmk_result *pmVar4;
  _func_void *p_Var5;
  int *piVar6;
  mmkuser_malloc_mock_returntype pvVar7;
  mmkuser_malloc_mock_returntype mmk_val__;
  _func_int_size_t *predicate_1;
  mmk_matcher *m_2;
  mmkuser_malloc_mock_binding *bind_1;
  mmk_params *param;
  mmkuser_malloc_mock_params reg_params;
  mmk_matcher *next;
  mmk_matcher *m_1;
  _func_int_size_t *predicate;
  mmk_matcher *m;
  mmkuser_malloc_mock_params *p;
  size_t times;
  mmkuser_malloc_mock_binding *bind;
  mmk_mock_ctx *mock;
  mmk_matcher *matcher_ctx;
  size_t param0_local;
  
  next = mmk_matcher_ctx();
  if (next == (mmk_matcher *)0x0) {
    memset(&param,0,0x20);
    reg_params.mmk_va_args__ = (mmk_va_param **)param0;
    mmk_verify_register_call(&param,0x20);
    for (bind_1 = (mmkuser_malloc_mock_binding *)mmk_mock_get_params();
        bind_1 != (mmkuser_malloc_mock_binding *)0x0;
        bind_1 = (mmkuser_malloc_mock_binding *)(bind_1->item).next) {
      pmVar1 = (bind_1->item).matcher_ctx;
      if (pmVar1->next == (mmk_matcher *)0x0) {
        if (param0 == (bind_1->params).param0) goto LAB_0010291f;
      }
      else {
        pmVar1 = pmVar1->next;
        if (pmVar1->kind == MMK_MATCHER_ANY) goto LAB_0010291f;
        if ((pmVar1->kind & 0x40000000) == MMK_MATCHER_ANY) {
          if (pmVar1->kind != MMK_MATCHER_THAT) goto LAB_0010291f;
          p_Var5 = mmk_matcher_get_predicate(pmVar1);
          mVar3 = (*p_Var5)(param0);
        }
        else {
          if (((param0 == (bind_1->params).param0) && ((pmVar1->kind & 2) == MMK_MATCHER_ANY)) ||
             ((param0 < (bind_1->params).param0 && ((pmVar1->kind & 4) == MMK_MATCHER_ANY))))
          goto LAB_00102a1b;
          if (param0 <= (bind_1->params).param0) goto LAB_0010291f;
          mVar3 = pmVar1->kind & 8;
        }
        if (mVar3 != 0) {
LAB_0010291f:
          if ((bind_1->result).then_errno != 0) {
            iVar2 = (bind_1->result).then_errno;
            piVar6 = __errno_location();
            *piVar6 = iVar2;
          }
          if (((bind_1->result).then_call != (_func_void *)0x0) &&
             ((bind_1->result).then_return == (void *)0x0)) {
            pvVar7 = (mmkuser_malloc_mock_returntype)(*(bind_1->result).then_call)(param0);
            return pvVar7;
          }
          if (((bind_1->result).then_call != (_func_void *)0x0) &&
             ((bind_1->result).then_return != (void *)0x0)) {
            (*(bind_1->result).then_call)(param0);
            return *(bind_1->result).then_return;
          }
          if ((bind_1->result).then_return != (void *)0x0) {
            return *(bind_1->result).then_return;
          }
          return mmkuser_malloc_mock_stub::zero__;
        }
      }
LAB_00102a1b:
    }
  }
  else {
    stub = mmk_ctx();
    mock_00 = (mmk_mock_ctx *)mmk_stub_context(stub);
    mmk_mock_report_call();
    if (next->kind == MMK_MATCHER_ANY) {
      data = mmk_malloc(0x50);
      pmVar4 = mmk_when_get_result();
      *(undefined8 *)((long)data + 0x10) = *(undefined8 *)pmVar4;
      *(void **)((long)data + 0x18) = pmVar4->then_return;
      *(_func_void **)((long)data + 0x20) = pmVar4->then_call;
      *(mmk_va_info **)((long)data + 0x28) = pmVar4->with_va;
      *(size_t *)((long)data + 0x48) = param0;
      mmk_when_impl(mock_00,data);
    }
    else if (next->kind == MMK_MATCHER_THAT) {
      p = (mmkuser_malloc_mock_params *)0x0;
      for (m = (mmk_matcher *)mmk_mock_params_begin(mock_00); m != (mmk_matcher *)0x0;
          m = (mmk_matcher *)mmk_mock_params_next(mock_00,m)) {
        if (next->next == (mmk_matcher *)0x0) {
          if (m->next != (mmk_matcher *)param0) goto LAB_00102750;
LAB_0010273d:
          p = (mmkuser_malloc_mock_params *)((long)&p->mmk_times__ + *(long *)m);
        }
        else {
          pmVar1 = next->next;
          if (pmVar1->kind == MMK_MATCHER_ANY) goto LAB_0010273d;
          if ((pmVar1->kind & 0x40000000) == MMK_MATCHER_ANY) {
            if (pmVar1->kind == MMK_MATCHER_THAT) {
              p_Var5 = mmk_matcher_get_predicate(pmVar1);
              iVar2 = (*p_Var5)(m->next);
              if (iVar2 == 0) goto LAB_00102750;
            }
            goto LAB_0010273d;
          }
          if ((((m->next != (mmk_matcher *)param0) || ((pmVar1->kind & 2) != MMK_MATCHER_ANY)) &&
              ((param0 <= m->next || ((pmVar1->kind & 4) != MMK_MATCHER_ANY)))) &&
             ((m->next <= param0 || ((pmVar1->kind & 8) != MMK_MATCHER_ANY)))) goto LAB_0010273d;
        }
LAB_00102750:
      }
      while (next != (mmk_matcher *)0x0) {
        reg_params.param0 = (size_t)next->next;
        mmk_free(next);
        next = (mmk_matcher *)reg_params.param0;
      }
      mmk_verify_set_times((size_t)p);
    }
  }
  return mmkuser_malloc_mock_stub::zero__;
}

Assistant:

void test_simple_case(void)
{
    static char ref[] = "hello";
    char buf[sizeof (ref)];

    malloc_mock m = mmk_mock("malloc@lib:strdup", malloc_mock);
    mmk_assert((mmk_fn) m != MMK_MOCK_INVALID);

    mmk_when(malloc(sizeof(ref)), .then_return = &(char*) { buf });

    char *dup = my_strdup("hello");

    /* mmk_verify is overkill in this case, mmk_verify should be used when you
     * care about testing interactions rather than external behaviour */
    int pass = mmk_verify(malloc(mmk_ge(size_t, sizeof (ref))), .times = 1);

    mmk_assert(pass);
    mmk_assert(dup == buf && !strcmp(ref, buf));

    mmk_reset(malloc);
}